

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

YieldResult * __thiscall
NEST::NESTcalc::GetYieldERWeighted
          (YieldResult *__return_storage_ptr__,NESTcalc *this,double energy,double density,
          double dfield,vector<double,_std::allocator<double>_> *ERYieldsParam,
          vector<double,_std::allocator<double>_> *EnergyParams,
          vector<double,_std::allocator<double>_> *FieldParams)

{
  double dVar1;
  bool OldW13eV;
  const_reference pvVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Wvalue WVar6;
  double local_f8;
  YieldResult result;
  double weightB;
  double weightG;
  YieldResult yieldsG;
  YieldResult yieldsB;
  double Wq_eV;
  Wvalue wvalue;
  vector<double,_std::allocator<double>_> *FieldParams_local;
  vector<double,_std::allocator<double>_> *EnergyParams_local;
  vector<double,_std::allocator<double>_> *ERYieldsParam_local;
  double dfield_local;
  double density_local;
  double energy_local;
  NESTcalc *this_local;
  
  dVar3 = VDetector::get_molarMass(this->fdetector);
  OldW13eV = VDetector::get_OldW13eV(this->fdetector);
  WVar6 = WorkFunction(density,dVar3,OldW13eV);
  Wq_eV = WVar6.Wq_eV;
  (*this->_vptr_NESTcalc[10])
            (energy,density,dfield,0x3ff0000000000000,&yieldsG.DeltaT_Scint,this,ERYieldsParam);
  (*this->_vptr_NESTcalc[2])(energy,density,dfield,0x3ff0000000000000,&weightG);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](EnergyParams,0);
  dVar3 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](EnergyParams,1);
  dVar1 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](EnergyParams,2);
  dVar5 = *pvVar2;
  dVar4 = log(energy);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](EnergyParams,3);
  dVar4 = erf(dVar5 * (dVar4 + *pvVar2));
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](FieldParams,0);
  dVar5 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](FieldParams,1);
  dVar5 = pow(dfield / dVar5,*pvVar2);
  dVar3 = dVar1 * dVar4 * (1.0 - 1.0 / (dVar5 + 1.0)) + dVar3;
  result.DeltaT_Scint = 1.0 - dVar3;
  memset(&local_f8,0,0x30);
  local_f8 = dVar3 * weightG + result.DeltaT_Scint * yieldsG.DeltaT_Scint;
  result.PhotonYield = dVar3 * yieldsG.PhotonYield + result.DeltaT_Scint * yieldsB.PhotonYield;
  result.ElectronYield = dVar3 * yieldsG.ElectronYield + result.DeltaT_Scint * yieldsB.ElectronYield
  ;
  result.ExcitonRatio = dVar3 * yieldsG.ExcitonRatio + result.DeltaT_Scint * yieldsB.ExcitonRatio;
  result.Lindhard = dVar3 * yieldsG.Lindhard + result.DeltaT_Scint * yieldsB.Lindhard;
  result.ElectricField = dVar3 * yieldsG.ElectricField + result.DeltaT_Scint * yieldsB.ElectricField
  ;
  (*this->_vptr_NESTcalc[0xb])(energy,Wq_eV,__return_storage_ptr__,this,&local_f8);
  return __return_storage_ptr__;
}

Assistant:

YieldResult NESTcalc::GetYieldERWeighted(
    double energy, double density, double dfield,
    const std::vector<double> &ERYieldsParam,
    const std::vector<double> &EnergyParams,
    const std::vector<double> &FieldParams) {
  Wvalue wvalue = WorkFunction(density, fdetector->get_molarMass(),
                               fdetector->get_OldW13eV());
  double Wq_eV = wvalue.Wq_eV;

  YieldResult yieldsB = GetYieldBetaGR(energy, density, dfield, ERYieldsParam);
  YieldResult yieldsG = GetYieldGamma(energy, density, dfield);
  double weightG =
      EnergyParams[0] +
      EnergyParams[1] * erf(EnergyParams[2] * (log(energy) + EnergyParams[3])) *
          (1. - (1. / (1. + pow(dfield / FieldParams[0], FieldParams[1]))));
  // field weighting added to match dependence reported by XELDA and LUX Run3.
  // Not validated beyond of fields on the order of a few hundred V/cm
  double weightB = 1. - weightG;

  YieldResult result{};
  result.PhotonYield =
      weightG * yieldsG.PhotonYield + weightB * yieldsB.PhotonYield;
  result.ElectronYield =
      weightG * yieldsG.ElectronYield + weightB * yieldsB.ElectronYield;
  result.ExcitonRatio =
      weightG * yieldsG.ExcitonRatio + weightB * yieldsB.ExcitonRatio;
  result.Lindhard = weightG * yieldsG.Lindhard + weightB * yieldsB.Lindhard;
  result.ElectricField =
      weightG * yieldsG.ElectricField + weightB * yieldsB.ElectricField;
  result.DeltaT_Scint =
      weightG * yieldsG.DeltaT_Scint + weightB * yieldsB.DeltaT_Scint;
  return YieldResultValidity(result, energy, Wq_eV);
}